

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QAnimationTimer::startAnimations(QAnimationTimer *this)

{
  bool bVar1;
  QUnifiedTimer *in_RDI;
  QList<QAbstractAnimation_*> *in_stack_ffffffffffffffe8;
  
  if (((ulong)(in_RDI->defaultDriver).super_QAnimationDriver.super_QObject.d_ptr.d & 0x10000000000)
      != 0) {
    *(undefined1 *)((long)&(in_RDI->defaultDriver).super_QAnimationDriver.super_QObject.d_ptr.d + 5)
         = 0;
    QUnifiedTimer::instance();
    QUnifiedTimer::maybeUpdateAnimationsToCurrentTime(in_RDI);
    QList<QAbstractAnimation_*>::operator+=
              ((QList<QAbstractAnimation_*> *)in_RDI,in_stack_ffffffffffffffe8);
    QList<QAbstractAnimation_*>::clear((QList<QAbstractAnimation_*> *)in_RDI);
    bVar1 = QList<QAbstractAnimation_*>::isEmpty((QList<QAbstractAnimation_*> *)0x66a116);
    if (!bVar1) {
      (*(in_RDI->super_QObject)._vptr_QObject[0xd])();
    }
  }
  return;
}

Assistant:

void QAnimationTimer::startAnimations()
{
    if (!startAnimationPending)
        return;
    startAnimationPending = false;

    //force timer to update, which prevents large deltas for our newly added animations
    QUnifiedTimer::instance()->maybeUpdateAnimationsToCurrentTime();

    //we transfer the waiting animations into the "really running" state
    animations += animationsToStart;
    animationsToStart.clear();
    if (!animations.isEmpty())
        restartAnimationTimer();
}